

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_trim_completeString_fn(int _i)

{
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  int line;
  char *pcVar4;
  char *pcVar5;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x123dc7;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"        ",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x123e05;
  AString_trim(&string,' ');
  if (string.capacity != 8) {
    uStack_50 = 0;
    local_58 = (char *)0x8;
    local_60 = "(8)";
    local_68 = (char *)string.capacity;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x222,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity");
  }
  uStack_50 = 0x123e23;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x222);
  if (string.buffer == (char *)0x0) {
    ppcVar3 = &local_58;
    pcVar2 = "Assertion \'_ck_x != NULL\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) (string).buffer != NULL";
    pcVar5 = "(void*) (string).buffer";
  }
  else {
    uStack_50 = 0x123e40;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x222);
    if (string.buffer == (char *)0x0) {
      pcVar1 = "(null)";
      pcVar2 = "";
LAB_00123f48:
      uStack_50 = 0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x222,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string).buffer == (\"\")","(string).buffer",pcVar2,pcVar1,pcVar2,"(\"\")")
      ;
    }
    if (*string.buffer != '\0') {
      pcVar2 = "\"";
      pcVar1 = string.buffer;
      goto LAB_00123f48;
    }
    uStack_50 = 0x123e70;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x222);
    if (string.size == 0) {
      uStack_50 = 0x123e8f;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x222);
      if (private_ACUtilsTest_AString_reallocCount == 0) {
        uStack_50 = 0x123eb0;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x223);
        uStack_50 = 0x123eb9;
        (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
        return;
      }
      ppcVar3 = &local_68;
      local_60 = "(0)";
      local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
      pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
      pcVar5 = "private_ACUtilsTest_AString_reallocCount";
      line = 0x223;
      goto LAB_0012401d;
    }
    ppcVar3 = &local_68;
    local_60 = "strlen(\"\")";
    local_68 = (char *)string.size;
    pcVar2 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar1 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).size == strlen(\"\")";
    pcVar5 = "(string).size";
  }
  line = 0x222;
LAB_0012401d:
  uStack_50 = 0;
  local_58 = (char *)0x0;
  *(code **)((long)ppcVar3 + -8) = test_AString_trim_nullptr_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,line,pcVar2,pcVar1,pcVar4,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_AString_trim_completeString)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("        ", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    AString_trim(&string, ' ');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}